

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testMultiFunctionAllowed(void)

{
  bool bVar1;
  ResultType RVar2;
  ArenaStringPtr *pAVar3;
  Arena *pAVar4;
  ostream *poVar5;
  Result local_108;
  Result local_e0;
  undefined4 local_b4;
  Result local_b0;
  FunctionDescription *local_88;
  FunctionDescription *function;
  ModelDescription *description;
  ValidationPolicy local_64;
  undefined1 local_60 [4];
  ValidationPolicy validationPolicy;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_60);
  CoreML::ValidationPolicy::ValidationPolicy(&local_64);
  local_64.allowsEmptyInput = true;
  local_64.allowsEmptyOutput = true;
  local_64.allowsMultipleFunctions = true;
  function = (FunctionDescription *)
             CoreML::Specification::Model::mutable_description((Model *)local_60);
  pAVar3 = &((ModelDescription *)function)->defaultfunctionname_;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)function);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar3,"foo",pAVar4);
  local_88 = CoreML::Specification::ModelDescription::add_functions((ModelDescription *)function);
  pAVar3 = &local_88->name_;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&local_88->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar3,"foo",pAVar4);
  CoreML::validateModelDescription(&local_b0,(ModelDescription *)function,9,&local_64);
  bVar1 = CoreML::Result::good(&local_b0);
  CoreML::Result::~Result(&local_b0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_64.allowsMultipleFunctions = false;
    CoreML::validateModelDescription(&local_e0,(ModelDescription *)function,9,&local_64);
    bVar1 = CoreML::Result::good(&local_e0);
    CoreML::Result::~Result(&local_e0);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x18b);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,
                               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                              );
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      CoreML::validateModelDescription(&local_108,(ModelDescription *)function,9,&local_64);
      RVar2 = CoreML::Result::type(&local_108);
      CoreML::Result::~Result(&local_108);
      if (RVar2 == MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION) {
        m._oneof_case_[0] = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x18b);
        poVar5 = std::operator<<(poVar5,": error: ");
        poVar5 = std::operator<<(poVar5,
                                 "((ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                );
        poVar5 = std::operator<<(poVar5," was false, expected true.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x188);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,
                             "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
                            );
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  local_b4 = 1;
  CoreML::Specification::Model::~Model((Model *)local_60);
  return m._oneof_case_[0];
}

Assistant:

int testMultiFunctionAllowed() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    validationPolicy.allowsMultipleFunctions = false;
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION);

    return 0;
}